

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O0

bool anon_unknown.dwarf_2b5ce::cmTarFilesFrom
               (string *file,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  ulong uVar4;
  ostream *poVar5;
  string_view sVar6;
  string local_768;
  undefined1 local_748 [8];
  ostringstream e_2;
  value_type local_5c0;
  string_view local_5a0;
  undefined1 local_590 [8];
  string line;
  string local_568;
  undefined1 local_548 [8];
  ostringstream e_1;
  long local_3d0;
  ifstream fin;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  string *file_local;
  
  bVar1 = cmsys::SystemTools::FileIsDirectory(file);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar5 = std::operator<<((ostream *)local_198,"-E tar --files-from= file \'");
    poVar5 = std::operator<<(poVar5,(string *)file);
    std::operator<<(poVar5,"\' is a directory");
    std::__cxx11::ostringstream::str();
    cmSystemTools::Error(&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    file_local._7_1_ = false;
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(&local_3d0,pcVar3,_S_in);
    bVar2 = std::ios::operator!((ios *)((long)&local_3d0 + *(long *)(local_3d0 + -0x18)));
    if ((bVar2 & 1) == 0) {
      std::__cxx11::string::string((string *)local_590);
      while( true ) {
        bVar1 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)&local_3d0,(string *)local_590,(bool *)0x0,0xffffffffffffffff)
        ;
        if (!bVar1) break;
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          sVar6 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_590);
          local_5a0 = sVar6;
          bVar1 = cmHasLiteralPrefix<12ul>(sVar6,(char (*) [12])"--add-file=");
          if (bVar1) {
            std::__cxx11::string::substr((ulong)&local_5c0,(ulong)local_590);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(files,&local_5c0);
            std::__cxx11::string::~string((string *)&local_5c0);
          }
          else {
            sVar6 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_590);
            bVar1 = cmHasLiteralPrefix<2ul>(sVar6,(char (*) [2])0xc51ad0);
            if (bVar1) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_748);
              poVar5 = std::operator<<((ostream *)local_748,"-E tar --files-from=\'");
              poVar5 = std::operator<<(poVar5,(string *)file);
              poVar5 = std::operator<<(poVar5,"\' file invalid line:\n");
              poVar5 = std::operator<<(poVar5,(string *)local_590);
              std::operator<<(poVar5,"\n");
              std::__cxx11::ostringstream::str();
              cmSystemTools::Error(&local_768);
              std::__cxx11::string::~string((string *)&local_768);
              file_local._7_1_ = false;
              line.field_2._12_4_ = 1;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_748);
              goto LAB_001773dd;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(files,(value_type *)local_590);
          }
        }
      }
      file_local._7_1_ = true;
      line.field_2._12_4_ = 1;
LAB_001773dd:
      std::__cxx11::string::~string((string *)local_590);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_548);
      poVar5 = std::operator<<((ostream *)local_548,"-E tar --files-from= file \'");
      poVar5 = std::operator<<(poVar5,(string *)file);
      std::operator<<(poVar5,"\' not found");
      std::__cxx11::ostringstream::str();
      cmSystemTools::Error(&local_568);
      std::__cxx11::string::~string((string *)&local_568);
      file_local._7_1_ = false;
      line.field_2._12_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_548);
    }
    std::ifstream::~ifstream(&local_3d0);
  }
  return file_local._7_1_;
}

Assistant:

bool cmTarFilesFrom(std::string const& file, std::vector<std::string>& files)
{
  if (cmSystemTools::FileIsDirectory(file)) {
    std::ostringstream e;
    e << "-E tar --files-from= file '" << file << "' is a directory";
    cmSystemTools::Error(e.str());
    return false;
  }
  cmsys::ifstream fin(file.c_str());
  if (!fin) {
    std::ostringstream e;
    e << "-E tar --files-from= file '" << file << "' not found";
    cmSystemTools::Error(e.str());
    return false;
  }
  std::string line;
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    if (line.empty()) {
      continue;
    }
    if (cmHasLiteralPrefix(line, "--add-file=")) {
      files.push_back(line.substr(11));
    } else if (cmHasLiteralPrefix(line, "-")) {
      std::ostringstream e;
      e << "-E tar --files-from='" << file << "' file invalid line:\n"
        << line << "\n";
      cmSystemTools::Error(e.str());
      return false;
    } else {
      files.push_back(line);
    }
  }
  return true;
}